

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O3

void ht_put(HashTable *ht,HTItemKey key,CrispyValue value)

{
  uint32_t uVar1;
  HTKeyType HVar2;
  table_item_t *ptVar3;
  _func_void_HTItem_ptr *p_Var4;
  _Bool _Var5;
  uint32_t uVar6;
  uint uVar7;
  HTItem *pHVar8;
  HTItem *pHVar9;
  uint64_t uVar10;
  HTItemKey *pHVar11;
  table_item_t **pptVar12;
  ulong uVar13;
  CrispyValue value_00;
  HashTable local_50;
  
  uVar6 = hash(key,ht->key_type);
  uVar1 = ht->cap;
  pHVar8 = (HTItem *)malloc(0x28);
  pHVar8->next = (table_item_t *)0x0;
  (pHVar8->key).field_0.key_ident_string = key.key_c_string;
  (pHVar8->key).field_0.ident_length = key.field_0.ident_length;
  (pHVar8->value).type = value.type;
  (pHVar8->value).field_1.p_value = (uint64_t)value.field_1;
  pptVar12 = ht->buckets + (uVar1 - 1 & uVar6);
  pHVar9 = *pptVar12;
  if (pHVar9 != (HTItem *)0x0) {
    HVar2 = ht->key_type;
    do {
      _Var5 = equals((HTItemKey)*(anon_struct_16_2_64a7050e_for_HTItemKey_0 *)&pHVar9->key,key,HVar2
                    );
      if (_Var5) {
        ptVar3 = (*pptVar12)->next;
        free(*pptVar12);
        *pptVar12 = pHVar8;
        pHVar8->next = ptVar3;
        goto LAB_00102524;
      }
      pHVar9 = (*pptVar12)->next;
      pptVar12 = &(*pptVar12)->next;
    } while (pHVar9 != (HTItem *)0x0);
  }
  *pptVar12 = pHVar8;
  ht->size = ht->size + 1;
LAB_00102524:
  if (ht->cap < ht->size) {
    HVar2 = ht->key_type;
    uVar10 = next_pow_of_2((ulong)ht->cap + 1);
    p_Var4 = ht->free_callback;
    uVar10 = next_pow_of_2(uVar10 & 0xffffffff);
    local_50.cap = (uint32_t)uVar10;
    local_50.size = 0;
    local_50.key_type = HVar2;
    local_50.free_callback = p_Var4;
    local_50.buckets = (HTItem **)calloc(uVar10 & 0xffffffff,8);
    uVar7 = ht->cap;
    if (uVar7 != 0) {
      uVar13 = 0;
      do {
        pHVar11 = &ht->buckets[uVar13]->key;
        if (pHVar11 != (HTItemKey *)0x0) {
          do {
            value_00._4_4_ = 0;
            value_00.type = pHVar11[1].key_int;
            value_00.field_1.p_value =
                 ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)((long)pHVar11 + 0x18))->p_value;
            ht_put(&local_50,*pHVar11,value_00);
            pHVar11 = (HTItemKey *)pHVar11[2].key_obj_string;
          } while (pHVar11 != (HTItemKey *)0x0);
          uVar7 = ht->cap;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar7);
    }
    ht_free(ht);
    ht->free_callback = local_50.free_callback;
    ht->buckets = local_50.buckets;
    ht->key_type = local_50.key_type;
    ht->cap = local_50.cap;
    *(ulong *)&ht->size = CONCAT44(local_50._12_4_,local_50.size);
  }
  return;
}

Assistant:

void ht_put(HashTable *ht, HTItemKey key, CrispyValue value) {
    uint32_t index = hash(key, ht->key_type) & (ht->cap - 1);
    HTItem *new_item = malloc(sizeof(HTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, ht->key_type, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}